

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::TokensBuilder::append
          (TokensBuilder *this,
          vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *chars,
          size_t begin,size_t end)

{
  ulong in_RCX;
  ulong in_RDX;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *in_RSI;
  TokensBuilder *in_RDI;
  size_t i;
  CharInfo *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  for (local_28 = in_RDX; local_28 < in_RCX; local_28 = local_28 + 1) {
    std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::operator[]
              (in_RSI,local_28);
    append(in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void append(const std::vector<unicode::CharInfo>& chars,
                const size_t begin,
                const size_t end)
    {
      for (size_t i = begin; i < end; ++i)
        append(chars[i]);
    }